

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O2

double __thiscall Symbol_table::get_value(Symbol_table *this,string *s)

{
  pointer pVVar1;
  undefined8 uVar2;
  __type _Var3;
  pointer __lhs;
  allocator<char> local_39;
  string local_38;
  
  __lhs = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
          super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
          _M_start;
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  while( true ) {
    if (__lhs == pVVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"get: undefined name ",&local_39);
      error(&local_38,s);
      uVar2 = std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      _Unwind_Resume(uVar2);
    }
    _Var3 = std::operator==(&__lhs->name,s);
    if (_Var3) break;
    __lhs = __lhs + 1;
  }
  return __lhs->value;
}

Assistant:

double Symbol_table::get_value(const string& s)
{
	for (auto&& var : var_table)
		if (var.name == s)
			return var.value;
	error("get: undefined name ", s);
}